

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jishmof.c
# Opt level: O2

int extract_motion_vectors(char *videopath)

{
  AVStream *pAVar1;
  AVFormatContext *pAVar2;
  FILE *pFVar3;
  int iVar4;
  uint uVar5;
  AVCodecContext *pAVar6;
  undefined8 uVar7;
  char *__ptr;
  size_t sStackY_c0;
  AVCodec *dec;
  undefined8 local_90;
  AVPacket pkt;
  
  pkt.duration = 0;
  pkt.pos = 0;
  pkt.side_data = (AVPacketSideData *)0x0;
  pkt.side_data_elems = 0;
  pkt._60_4_ = 0;
  pkt.size = 0;
  pkt.stream_index = 0;
  pkt.flags = 0;
  pkt._44_4_ = 0;
  pkt.dts = 0;
  pkt.data = (uint8_t *)0x0;
  pkt.buf = (AVBufferRef *)0x0;
  pkt.pts = 0;
  pkt.convergence_duration = 0;
  src_filename = videopath;
  iVar4 = avformat_open_input(&pFormatCtx,videopath,0,0);
  if (iVar4 < 0) {
    fprintf(_stderr,"Could not open source file %s\n",src_filename);
  }
  else {
    iVar4 = avformat_find_stream_info(pFormatCtx,0);
    pAVar2 = pFormatCtx;
    if (-1 < iVar4) {
      dec = (AVCodec *)0x0;
      local_90 = 0;
      uVar5 = av_find_best_stream(pFormatCtx,0,0xffffffff,0xffffffff,&dec,0);
      pFVar3 = _stderr;
      if ((int)uVar5 < 0) {
        uVar7 = av_get_media_type_string(0);
        fprintf(pFVar3,"Could not find %s stream in input file \'%s\'\n",uVar7,src_filename);
      }
      else {
        pAVar1 = pAVar2->streams[uVar5];
        pAVar6 = (AVCodecContext *)avcodec_alloc_context3(dec);
        if (pAVar6 == (AVCodecContext *)0x0) {
          __ptr = "Failed to allocate codec\n";
          sStackY_c0 = 0x19;
        }
        else {
          iVar4 = avcodec_parameters_to_context(pAVar6,pAVar1->codecpar);
          if (-1 < iVar4) {
            av_dict_set(&local_90,"flags2","+export_mvs",0);
            iVar4 = avcodec_open2(pAVar6,dec,&local_90);
            pFVar3 = _stderr;
            if (iVar4 < 0) {
              uVar7 = av_get_media_type_string(0);
              fprintf(pFVar3,"Failed to open %s codec\n",uVar7);
            }
            else {
              video_stream = pAVar2->streams[uVar5];
              video_stream_idx = uVar5;
              pCodecCtx = pAVar6;
            }
            goto LAB_0010254c;
          }
          __ptr = "Failed to copy codec parameters to codec context\n";
          sStackY_c0 = 0x31;
        }
        fwrite(__ptr,sStackY_c0,1,_stderr);
      }
LAB_0010254c:
      uVar5 = 0;
      av_dump_format(pFormatCtx,0,src_filename,0);
      if (video_stream == (AVStream *)0x0) {
        fwrite("Could not find video stream in the input, aborting\n",0x33,1,_stderr);
      }
      else {
        pFrame = (AVFrame *)av_frame_alloc();
        if (pFrame == (AVFrame *)0x0) {
          fwrite("Could not allocate frame\n",0x19,1,_stderr);
          uVar5 = 1;
        }
        else {
          putchar(10);
          puts(
              "**************************************************************************************"
              );
          puts(
              "*       Tool : MV-Tractus (MARK-)                                                    *"
              );
          puts(
              "*     Author : Jishnu Jaykumar Padalunkal (https://jishnujayakumar.github.io)        *"
              );
          puts(
              "*  Used Libs : FFmpeg                                                                *"
              );
          puts(
              "*Description : A simple tool to extract motion vectors from MPEG videos              *"
              );
          puts(
              "**************************************************************************************"
              );
          putchar(10);
          puts(
              "--------------------------------------------------------------------------------------"
              );
          puts(
              "framenum,source,blockw,blockh,srcx,srcy,dstx,dsty,motion_x,motion_y,motion_scale,flags"
              );
          puts(
              "--------------------------------------------------------------------------------------"
              );
          pFrameRGB = (AVFrame *)av_frame_alloc();
          if (pFrameRGB == (AVFrame *)0x0) {
            return -1;
          }
          numBytes = avpicture_get_size(2,pCodecCtx->width,pCodecCtx->height);
          buffer = (uint8_t *)av_malloc((long)numBytes);
          avpicture_fill(pFrameRGB,buffer,2,pCodecCtx->width,pCodecCtx->height);
          sws_ctx = (SwsContext *)
                    sws_getContext(pCodecCtx->width,pCodecCtx->height,pCodecCtx->pix_fmt,
                                   pCodecCtx->width,pCodecCtx->height,2,2,0,0,0);
          iVar4 = 0;
          do {
            uVar5 = av_read_frame(pFormatCtx,&pkt);
            if ((int)uVar5 < 0) break;
            if (pkt.stream_index == video_stream_idx) {
              iVar4 = decode_packet(&pkt);
            }
            av_packet_unref();
          } while (-1 < iVar4);
          decode_packet((AVPacket *)0x0);
          puts(
              "\n--------------------------------------------------------------------------------------"
              );
          uVar5 = ~uVar5 >> 0x1f;
        }
      }
      avcodec_free_context(&pCodecCtx);
      avformat_close_input(&pFormatCtx);
      av_frame_free(&pFrame);
      return uVar5;
    }
    fwrite("Could not find stream information\n",0x22,1,_stderr);
  }
  exit(1);
}

Assistant:

int extract_motion_vectors(char *videopath){
    int ret = 0;
    AVPacket pkt = { 0 };
    struct stat sb;
    // char command[50];
    // char output[13]="./output/mv/";
    // if (!(stat(output, &sb) == 0 && S_ISDIR(sb.st_mode)))
    // {
    //     sprintf(command,"mkdir %s", output);
	  //     system(command);
    // }

    /*if (argc != 2) {
        fprintf(stderr, "Usage: %s <video>\n", argv[0]);
        exit(1);
    }*/

    src_filename = videopath;

    if (avformat_open_input(&pFormatCtx, src_filename, NULL, NULL) < 0) {
        fprintf(stderr, "Could not open source file %s\n", src_filename);
        exit(1);
    }

    if (avformat_find_stream_info(pFormatCtx, NULL) < 0) {
        fprintf(stderr, "Could not find stream information\n");
        exit(1);
    }

    open_codec_context(pFormatCtx, AVMEDIA_TYPE_VIDEO);

    av_dump_format(pFormatCtx, 0, src_filename, 0);

    if (!video_stream) {
        fprintf(stderr, "Could not find video stream in the input, aborting\n");
        ret = 1;
        goto end;
    }

    pFrame = av_frame_alloc();
    if (!pFrame) {
        fprintf(stderr, "Could not allocate frame\n");
        ret = AVERROR(ENOMEM);
        goto end;
    }
    printf("\n");
    printf("**************************************************************************************\n");
    printf("*       Tool : MV-Tractus (MARK-)                                                    *\n");
    printf("*     Author : Jishnu Jaykumar Padalunkal (https://jishnujayakumar.github.io)        *\n");
    printf("*  Used Libs : FFmpeg                                                                *\n");
    printf("*Description : A simple tool to extract motion vectors from MPEG videos              *\n");
    printf("**************************************************************************************\n");
    printf("\n");
    printf("--------------------------------------------------------------------------------------\n");
    printf("framenum,source,blockw,blockh,srcx,srcy,dstx,dsty,motion_x,motion_y,motion_scale,flags\n");
    printf("--------------------------------------------------------------------------------------\n");

    // Allocate an AVFrame structure
    pFrameRGB=av_frame_alloc();
    if(pFrameRGB==NULL)
      return -1;

    // Determine required buffer size and allocate buffer
    numBytes=avpicture_get_size(AV_PIX_FMT_RGB24, pCodecCtx->width,
  			      pCodecCtx->height);
    buffer=(uint8_t *)av_malloc(numBytes*sizeof(uint8_t));

    // Assign appropriate parts of buffer to image planes in pFrameRGB
    // Note that pFrameRGB is an AVFrame, but AVFrame is a superset
    // of AVPicture
    avpicture_fill((AVPicture *)pFrameRGB, buffer, AV_PIX_FMT_RGB24,
  		 pCodecCtx->width, pCodecCtx->height);
    // initialize SWS context for software scaling
    sws_ctx = sws_getContext(
           pCodecCtx->width,
  			   pCodecCtx->height,
  			   pCodecCtx->pix_fmt,
  			   pCodecCtx->width,
  			   pCodecCtx->height,
  			   AV_PIX_FMT_RGB24,
  			   SWS_BILINEAR,
  			   NULL,
  			   NULL,
  			   NULL
  			   );



    /* read frames from the file */
    while (av_read_frame(pFormatCtx, &pkt) >= 0) {
        if (pkt.stream_index == video_stream_idx){
              // printf("\nDecoding Packets\n");
              ret=decode_packet(&pkt);
              // ret = decode_packet(&pkt);
              // avcodec_decode_video2(pCodecCtx, pFrame, &frameFinished, &p);

        }
        av_packet_unref(&pkt);
        if (ret < 0)
            break;
    }

    /* flush cached frames */
    decode_packet(NULL);
    printf("\n--------------------------------------------------------------------------------------\n");

end:
    avcodec_free_context(&pCodecCtx);
    avformat_close_input(&pFormatCtx);
    av_frame_free(&pFrame);
    return ret < 0;
}